

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::getOffsetRange(TextureGatherCase *this)

{
  int iVar1;
  int y_;
  ContextInfo *pCVar2;
  long in_RSI;
  TextureGatherCase *this_local;
  
  iVar1 = *(int *)(in_RSI + 0x7c);
  if (iVar1 == 0) {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,0);
  }
  else if (iVar1 == 1) {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,-8,7);
  }
  else if (iVar1 == 2) {
    pCVar2 = gles31::Context::getContextInfo(*(Context **)(in_RSI + 0x70));
    iVar1 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x8e5e);
    pCVar2 = gles31::Context::getContextInfo(*(Context **)(in_RSI + 0x70));
    y_ = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x8e5f);
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,iVar1,y_);
  }
  else {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,-1);
  }
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 TextureGatherCase::getOffsetRange (void) const
{
	switch (m_offsetSize)
	{
		case OFFSETSIZE_NONE:
			return IVec2(0);
			break;

		case OFFSETSIZE_MINIMUM_REQUIRED:
			// \note Defined by spec.
			return IVec2(SPEC_MAX_MIN_OFFSET,
						 SPEC_MIN_MAX_OFFSET);
			break;

		case OFFSETSIZE_IMPLEMENTATION_MAXIMUM:
			return IVec2(m_context.getContextInfo().getInt(GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET),
						 m_context.getContextInfo().getInt(GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET));
			break;

		default:
			DE_ASSERT(false);
			return IVec2(-1);
	}
}